

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(String *l,
                   StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  bool bVar1;
  string_view __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string local_40;
  
  __x = AsStringView<cm::String>::view(l);
  StringOpPlus::operator_cast_to_string(&local_40,(StringOpPlus *)r);
  __y._M_str = local_40._M_dataplus._M_p;
  __y._M_len = local_40._M_string_length;
  bVar1 = std::operator==(__x,__y);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

typename std::enable_if<AsStringView<L>::value, bool>::type operator==(
  L&& l, StringOpPlus<RL, RR> const& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) == std::string(r);
}